

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ordering_Equality.cpp
# Opt level: O0

Result __thiscall
Kernel::Ordering::compare_s1It1_s2It2
          (Ordering *this,TermList s1,TermList s2,TermList t1,TermList t2)

{
  int iVar1;
  Result r;
  TermList in_RCX;
  TermList in_RDX;
  TermList in_RSI;
  long *in_RDI;
  TermList in_R8;
  undefined4 in_stack_ffffffffffffff78;
  TermList in_stack_ffffffffffffff80;
  TermList in_stack_ffffffffffffff88;
  TermList in_stack_ffffffffffffff90;
  TermList in_stack_ffffffffffffff98;
  undefined4 local_4;
  
  iVar1 = (**(code **)(*in_RDI + 0x18))(in_RDI,in_RSI._content,in_R8._content);
  if (iVar1 == 1) {
    local_4 = compare_s1Gt1_s1It2_s2It1
                        ((Ordering *)CONCAT44(1,in_stack_ffffffffffffff78),in_stack_ffffffffffffff98
                         ,in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
                         in_stack_ffffffffffffff80);
  }
  else if (iVar1 == 2) {
    r = compare_s1Gt1_s1It2_s2It1
                  ((Ordering *)CONCAT44(2,in_stack_ffffffffffffff78),in_R8,in_RCX,in_RSI,in_RDX);
    local_4 = reverse(r);
  }
  else {
    local_4 = INCOMPARABLE;
  }
  return local_4;
}

Assistant:

Ordering::Result Ordering::compare_s1It1_s2It2(TermList s1,TermList s2,TermList t1,TermList t2) const
{
  ASS_EQ(compare(s1,t1), INCOMPARABLE);
  ASS_EQ(compare(s2,t2), INCOMPARABLE);

  switch(compare(s1,t2)) {
  case GREATER:
    return compare_s1Gt1_s1It2_s2It1(s1,s2,t2,t1);
  case INCOMPARABLE:
    return INCOMPARABLE;
  case LESS:
    return reverse(compare_s1Gt1_s1It2_s2It1(t2,t1,s1,s2));
  default:
    ASSERTION_VIOLATION;
  }
}